

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

PieceType banksia::BoardCore::charactorToPieceType(char ch)

{
  undefined *puVar1;
  byte bVar2;
  char *pcVar3;
  
  puVar1 = pieceTypeName;
  bVar2 = ch | 0x20;
  if (0x18 < (byte)(ch + 0xbfU)) {
    bVar2 = ch;
  }
  pcVar3 = strchr(pieceTypeName,(int)(char)bVar2);
  return (int)pcVar3 - (int)puVar1;
}

Assistant:

PieceType BoardCore::charactorToPieceType(char ch)
{
    if (ch >= 'A' && ch < 'Z') {
        ch += 'a' - 'A';
    }
    auto pieceType = PieceType::empty;
    const char* p = strchr(pieceTypeName, ch);
    int k = int(p - pieceTypeName);
    pieceType = static_cast<PieceType>(k);
    return pieceType;
}